

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorTiledVertical.cpp
# Opt level: O0

void __thiscall Rml::DecoratorTiledVertical::~DecoratorTiledVertical(DecoratorTiledVertical *this)

{
  DecoratorTiledVertical *this_local;
  
  ~DecoratorTiledVertical(this);
  operator_delete(this,0x118);
  return;
}

Assistant:

bool DecoratorTiledVertical::Initialise(const Tile* _tiles, const Texture* _textures)
{
	// Load the textures.
	for (int i = 0; i < 3; i++)
	{
		tiles[i] = _tiles[i];
		tiles[i].texture_index = AddTexture(_textures[i]);
	}

	// If only one side of the decorator has been configured, then mirror the texture for the other side.
	if (tiles[TOP].texture_index == -1 && tiles[BOTTOM].texture_index > -1)
	{
		tiles[TOP] = tiles[BOTTOM];
		tiles[TOP].orientation = FLIP_HORIZONTAL;
	}
	else if (tiles[BOTTOM].texture_index == -1 && tiles[TOP].texture_index > -1)
	{
		tiles[BOTTOM] = tiles[TOP];
		tiles[BOTTOM].orientation = FLIP_HORIZONTAL;
	}
	else if (tiles[TOP].texture_index == -1 && tiles[BOTTOM].texture_index == -1)
		return false;

	if (tiles[CENTRE].texture_index == -1)
		return false;

	return true;
}